

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O0

void Kernel::InferenceStore::Smt2ProofCheckPrinter::outputFunctionName(ostream *out,uint f)

{
  bool bVar1;
  InnerType *pIVar2;
  ostream *poVar3;
  char *pcVar4;
  uint in_ESI;
  ostream *in_RDI;
  string *name;
  RealConstantType r;
  IntegerConstantType i;
  Theory *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe94;
  uint uVar5;
  Theory *in_stack_fffffffffffffe98;
  IntegerConstantType *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  Interpretation itp;
  ostream *in_stack_fffffffffffffeb0;
  int iVar6;
  Signature *in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec8;
  int number;
  ostream *in_stack_fffffffffffffed0;
  IntegerConstantType local_c0;
  IntegerConstantType local_b0 [4];
  IntegerConstantType local_70 [3];
  RationalConstantType local_40;
  undefined1 local_20 [20];
  uint local_c;
  ostream *local_8;
  
  number = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  itp = (Interpretation)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  local_c = in_ESI;
  local_8 = in_RDI;
  bVar1 = Theory::isInterpretedFunction(in_stack_fffffffffffffe88,0);
  if (bVar1) {
    Theory::interpretFunction
              ((Theory *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               (uint)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    outputInterpretationName(in_stack_fffffffffffffeb0,itp);
  }
  else {
    bVar1 = Theory::isInterpretedConstant(in_stack_fffffffffffffe88,0);
    iVar6 = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
    if (bVar1) {
      IntegerConstantType::IntegerConstantType((IntegerConstantType *)0x86a988);
      RealConstantType::RealConstantType((RealConstantType *)0x86a995);
      bVar1 = Theory::tryInterpretConstant
                        (in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
                         (IntegerConstantType *)in_stack_fffffffffffffe88);
      if (bVar1) {
        IntegerConstantType::IntegerConstantType
                  (in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
        bVar1 = Kernel::operator<((IntegerConstantType *)in_stack_fffffffffffffe88,
                                  (IntegerConstantType *)0x86a9f4);
        IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x86aa0a);
        if (bVar1) {
          std::operator<<(local_8,"(- ");
          IntegerConstantType::abs(local_70,(int)local_20);
          poVar3 = Kernel::operator<<((ostream *)
                                      CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                      (IntegerConstantType *)in_stack_fffffffffffffe88);
          std::operator<<(poVar3,")");
          IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x86aa85);
        }
        else {
          Kernel::operator<<((ostream *)
                             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                             (IntegerConstantType *)in_stack_fffffffffffffe88);
        }
      }
      else {
        bVar1 = Theory::tryInterpretConstant
                          (in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
                           (RealConstantType *)in_stack_fffffffffffffe88);
        iVar6 = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
        if (!bVar1) {
          pcVar4 = (char *)__cxa_allocate_exception(0x50);
          Lib::UserErrorException::Exception
                    ((UserErrorException *)
                     CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),pcVar4);
          __cxa_throw(pcVar4,&Lib::UserErrorException::typeinfo,
                      Lib::UserErrorException::~UserErrorException);
        }
        RealConstantType::RealConstantType((RealConstantType *)in_stack_fffffffffffffed0,number);
        bVar1 = Kernel::operator<((RealConstantType *)
                                  CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                  (RealConstantType *)in_stack_fffffffffffffe88);
        RealConstantType::~RealConstantType((RealConstantType *)0x86ab90);
        if (bVar1) {
          std::operator<<(local_8,"(-");
        }
        RationalConstantType::denominator(&local_40);
        IntegerConstantType::IntegerConstantType(in_stack_fffffffffffffea0,iVar6);
        bVar1 = Kernel::operator!=((IntegerConstantType *)
                                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                   (IntegerConstantType *)in_stack_fffffffffffffe88);
        IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x86ac25);
        if (bVar1) {
          in_stack_fffffffffffffed0 = local_8;
          pIVar2 = RationalConstantType::numerator(&local_40);
          IntegerConstantType::abs(local_b0,(int)pIVar2);
          poVar3 = Kernel::operator<<((ostream *)
                                      CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                      (IntegerConstantType *)in_stack_fffffffffffffe88);
          std::operator<<(poVar3,".0");
          number = (int)((ulong)poVar3 >> 0x20);
          IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x86aca0);
        }
        else {
          std::operator<<(local_8,"(/ ");
          pIVar2 = RationalConstantType::numerator(&local_40);
          IntegerConstantType::abs(&local_c0,(int)pIVar2);
          poVar3 = Kernel::operator<<((ostream *)
                                      CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                      (IntegerConstantType *)in_stack_fffffffffffffe88);
          std::operator<<(poVar3,".0 ");
          RationalConstantType::denominator(&local_40);
          poVar3 = Kernel::operator<<((ostream *)
                                      CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                      (IntegerConstantType *)in_stack_fffffffffffffe88);
          std::operator<<(poVar3,".0)");
          IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x86adaf);
        }
        RealConstantType::RealConstantType((RealConstantType *)in_stack_fffffffffffffed0,number);
        bVar1 = Kernel::operator<((RealConstantType *)
                                  CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                  (RealConstantType *)in_stack_fffffffffffffe88);
        uVar5 = (uint)bVar1 << 0x18;
        RealConstantType::~RealConstantType((RealConstantType *)0x86ae10);
        if ((uVar5 & 0x1000000) != 0) {
          std::operator<<(local_8,")");
        }
      }
      RealConstantType::~RealConstantType((RealConstantType *)0x86aec6);
      IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x86aed3);
    }
    else {
      bVar1 = Signature::isFoolConstantSymbol(DAT_01333830,true,local_c);
      if (bVar1) {
        std::operator<<(local_8,"true");
      }
      else {
        bVar1 = Signature::isFoolConstantSymbol(DAT_01333830,false,local_c);
        if (bVar1) {
          std::operator<<(local_8,"false");
        }
        else {
          Signature::functionName_abi_cxx11_(in_stack_fffffffffffffeb8,iVar6);
          outputQuoted((ostream *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                       (string *)in_stack_fffffffffffffe88);
        }
      }
    }
  }
  return;
}

Assistant:

static void outputFunctionName(std::ostream& out, unsigned f) 
  {
    if (theory->isInterpretedFunction(f)) {
      outputInterpretationName(out, theory->interpretFunction(f));
    } else if (theory->isInterpretedConstant(f)) {
      IntegerConstantType i;
      RealConstantType r;
      if (theory->tryInterpretConstant(f, i)) {
        if (i < IntegerConstantType(0)) {
          out << "(- " << i.abs() << ")";
        } else {
          out << i;
        }

      } else if (theory->tryInterpretConstant(f, r)) {
        if (r < RealConstantType(0)) {
          out << "(-";
        }
        if (r.denominator() != IntegerConstantType(1)) {
          out << r.numerator().abs() << ".0";
        } else {
          out << "(/ " << r.numerator().abs() << ".0 " << r.denominator() << ".0)";
        }
        if (r < RealConstantType(0)) {
          out << ")";
        }

      } else {
        throw UserErrorException("only reals and integers are allowed in smt2");
      }

    } else if (env.signature->isFoolConstantSymbol(true, f)) {
      out << "true";

    } else if (env.signature->isFoolConstantSymbol(false, f)) {
      out << "false";

    } else {
      auto& name = env.signature->functionName(f);
      outputQuoted(out, name);
    }
  }